

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O1

void ImTui_ImplText_RenderDrawData(ImDrawData *drawData,TScreen *screen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ImDrawList *pIVar10;
  ImDrawCmd *pIVar11;
  unsigned_short *puVar12;
  ImDrawVert *pIVar13;
  byte bVar14;
  undefined4 in_EAX;
  int iVar15;
  uint uVar16;
  ImGuiIO *pIVar17;
  TCell *pTVar18;
  uchar col;
  uint uVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  int iVar34;
  int iVar36;
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float local_118;
  undefined1 local_c8 [48];
  float local_98;
  float fStack_94;
  float local_88;
  float fStack_84;
  
  iVar34 = (int)((drawData->FramebufferScale).x * (drawData->DisplaySize).x);
  iVar36 = (int)((drawData->FramebufferScale).y * (drawData->DisplaySize).y);
  auVar31._0_4_ = -(uint)(0 < iVar34);
  auVar31._4_4_ = -(uint)(0 < iVar34);
  auVar31._8_4_ = -(uint)(0 < iVar36);
  auVar31._12_4_ = -(uint)(0 < iVar36);
  iVar15 = movmskpd(in_EAX,auVar31);
  if (iVar15 == 3) {
    pIVar17 = ImGui::GetIO();
    IVar3 = pIVar17->DisplaySize;
    pIVar17 = ImGui::GetIO();
    local_118 = IVar3.x;
    iVar15 = (int)(pIVar17->DisplaySize).y;
    screen->nx = (int)local_118;
    screen->ny = iVar15;
    if (screen->nmax < iVar15 * (int)local_118) {
      if (screen->data != (TCell *)0x0) {
        operator_delete__(screen->data);
      }
      lVar20 = (long)screen->ny * (long)screen->nx;
      iVar15 = (int)lVar20;
      screen->nmax = iVar15;
      uVar24 = 0xffffffffffffffff;
      if (-1 < iVar15) {
        uVar24 = lVar20 * 4;
      }
      pTVar18 = (TCell *)operator_new__(uVar24);
      screen->data = pTVar18;
    }
    if (screen->data != (TCell *)0x0) {
      memset(screen->data,0,(long)screen->ny * (long)screen->nx * 4);
    }
    if (0 < drawData->CmdListsCount) {
      IVar3 = drawData->DisplayPos;
      IVar4 = drawData->FramebufferScale;
      lVar20 = 0;
      do {
        pIVar10 = drawData->CmdLists[lVar20];
        if (0 < (pIVar10->CmdBuffer).Size) {
          lVar21 = 0;
          do {
            pIVar11 = (pIVar10->CmdBuffer).Data;
            uVar1 = pIVar11[lVar21].ClipRect.x;
            uVar5 = pIVar11[lVar21].ClipRect.y;
            local_88 = IVar3.x;
            fStack_84 = IVar3.y;
            local_98 = IVar4.x;
            fStack_94 = IVar4.y;
            fVar37 = ((float)uVar1 - local_88) * local_98;
            fVar38 = ((float)uVar5 - fStack_84) * fStack_94;
            if ((fVar37 < (float)iVar34) && (fVar38 < (float)iVar36)) {
              uVar2 = pIVar11[lVar21].ClipRect.z;
              uVar6 = pIVar11[lVar21].ClipRect.w;
              local_98 = ((float)uVar2 - local_88) * local_98;
              fStack_94 = ((float)uVar6 - fStack_84) * fStack_94;
              if ((0.0 <= local_98) && ((0.0 <= fStack_94 && (pIVar11[lVar21].ElemCount != 0)))) {
                local_c8._4_4_ = fStack_94 + -1.0;
                local_c8._0_4_ = local_98 + -1.0;
                local_c8._8_8_ = 0;
                uVar26 = 0;
                fVar27 = -10000.0;
                uVar42 = 0;
                uVar43 = 0;
                uVar44 = 0;
                fVar32 = fVar27;
                do {
                  uVar16 = pIVar11[lVar21].IdxOffset;
                  iVar15 = uVar16 + uVar26;
                  puVar12 = (pIVar10->IdxBuffer).Data;
                  pIVar13 = (pIVar10->VtxBuffer).Data;
                  uVar7 = puVar12[iVar15];
                  uVar8 = puVar12[(int)(uVar16 + 1 + uVar26)];
                  uVar9 = puVar12[(int)(uVar16 + 2 + uVar26)];
                  auVar47._8_8_ = 0;
                  auVar47._0_4_ = pIVar13[uVar7].pos.x;
                  auVar47._4_4_ = pIVar13[uVar7].pos.y;
                  auVar45._8_8_ = 0;
                  auVar45._0_4_ = pIVar13[uVar8].pos.x;
                  auVar45._4_4_ = pIVar13[uVar8].pos.y;
                  auVar46._8_8_ = 0;
                  auVar46._0_4_ = pIVar13[uVar9].pos.x;
                  auVar46._4_4_ = pIVar13[uVar9].pos.y;
                  auVar31 = minps(auVar47,local_c8._0_16_);
                  auVar39._4_4_ = fVar38;
                  auVar39._0_4_ = fVar37;
                  auVar39._8_8_ = 0;
                  auVar39 = maxps(auVar39,auVar31);
                  auVar31 = minps(auVar45,local_c8._0_16_);
                  auVar33._4_4_ = fVar38;
                  auVar33._0_4_ = fVar37;
                  auVar33._8_8_ = 0;
                  auVar31 = maxps(auVar33,auVar31);
                  auVar47 = minps(auVar46,local_c8._0_16_);
                  auVar35._4_4_ = fVar38;
                  auVar35._0_4_ = fVar37;
                  auVar35._8_8_ = 0;
                  auVar47 = maxps(auVar35,auVar47);
                  fVar29 = pIVar13[uVar7].uv.x;
                  fVar30 = pIVar13[uVar8].uv.x;
                  uVar16 = pIVar13[uVar7].col;
                  if ((((fVar29 != fVar30) || (fVar28 = pIVar13[uVar9].uv.x, fVar29 != fVar28)) ||
                      (fVar30 != fVar28)) || (NAN(fVar30) || NAN(fVar28))) {
LAB_00124e4f:
                    auVar40._4_4_ = auVar39._4_4_ + auVar31._4_4_ + auVar47._4_4_;
                    auVar40._0_4_ = auVar40._4_4_;
                    auVar40._8_4_ = auVar40._4_4_;
                    auVar40._12_4_ = auVar40._4_4_;
                    auVar41._4_12_ = auVar40._4_12_;
                    fVar29 = (pIVar13[puVar12[iVar15 + 3]].pos.x +
                              auVar39._0_4_ + auVar31._0_4_ + auVar47._0_4_ +
                              pIVar13[puVar12[iVar15 + 4]].pos.x +
                             pIVar13[puVar12[iVar15 + 5]].pos.x) / 6.0;
                    auVar41._0_4_ =
                         (auVar40._4_4_ + pIVar13[puVar12[iVar15 + 3]].pos.y +
                          pIVar13[puVar12[iVar15 + 4]].pos.y + pIVar13[puVar12[iVar15 + 5]].pos.y) /
                         6.0 + 0.5;
                    if ((ABS(auVar41._0_4_ - fVar27) < 0.5) && (ABS(fVar29 - fVar32) < 0.5)) {
                      fVar29 = fVar32 + 1.0;
                      auVar41._4_4_ = uVar42;
                      auVar41._0_4_ = fVar27;
                      auVar41._8_4_ = uVar43;
                      auVar41._12_4_ = uVar44;
                    }
                    fVar32 = (float)(int)(fVar29 + 1.0);
                    fVar27 = auVar41._0_4_;
                    if ((fVar37 <= fVar32) && (fVar32 < local_98)) {
                      fVar32 = (float)(int)(fVar27 + 0.0);
                      if ((fVar38 <= fVar32) && (fVar32 < fStack_94)) {
                        pTVar18 = screen->data;
                        lVar25 = (long)((int)(fVar27 + 0.0) * screen->nx + (int)(fVar29 + 1.0));
                        uVar23 = uVar16 >> 0x18 |
                                 (uint)*(byte *)((long)pTVar18 + lVar25 * 4 + 3) << 0x18;
                        pTVar18[lVar25] = uVar23;
                        uVar22 = uVar16 >> 8 & 0xff;
                        uVar19 = uVar16 >> 0x10 & 0xff;
                        if (uVar22 == uVar19 && (uVar16 & 0xff) == uVar22) {
                          uVar19 = 0x10;
                          if ((7 < (byte)uVar16) && (uVar19 = 0xe7, (byte)uVar16 < 0xf9)) {
                            fVar28 = roundf(((float)(int)((uVar16 & 0xff) - 8) / 247.0) * 24.0);
                            fVar28 = fVar28 + 232.0;
                            goto LAB_00125238;
                          }
                        }
                        else {
                          fVar32 = roundf(((float)(uVar16 & 0xff) / 255.0) * 5.0);
                          fVar30 = roundf(((float)uVar22 / 255.0) * 5.0);
                          fVar28 = roundf(((float)uVar19 / 255.0) * 5.0);
                          fVar28 = fVar28 + fVar30 * 6.0 + fVar32 * 36.0 + 16.0;
LAB_00125238:
                          uVar19 = (uint)fVar28;
                        }
                        pTVar18[lVar25] = (uVar19 & 0xff) << 0x10 | uVar23;
                      }
                    }
                    uVar26 = uVar26 + 3;
                    uVar42 = auVar41._4_4_;
                    uVar43 = auVar41._8_4_;
                    uVar44 = auVar41._12_4_;
                  }
                  else {
                    fVar29 = pIVar13[uVar7].uv.y;
                    fVar30 = pIVar13[uVar8].uv.y;
                    if (((fVar29 != fVar30) || (fVar28 = pIVar13[uVar9].uv.y, fVar29 != fVar28)) ||
                       ((fVar30 != fVar28 || (NAN(fVar30) || NAN(fVar28))))) goto LAB_00124e4f;
                    uVar19 = uVar16 & 0xff;
                    uVar23 = uVar16 >> 8 & 0xff;
                    uVar22 = uVar16 >> 0x10 & 0xff;
                    if (uVar23 == uVar22 && uVar19 == uVar23) {
                      uVar16 = (uint)(((float)(uVar16 >> 0x18) * (float)uVar19) / 255.0);
                      col = '\x10';
                      bVar14 = (byte)uVar16;
                      if (7 < bVar14) {
                        col = 0xe7;
                        if (bVar14 < 0xf9) {
                          fVar28 = roundf(((float)(int)((uVar16 & 0xff) - 8) / 247.0) * 24.0);
                          fVar28 = fVar28 + 232.0;
                          goto LAB_00125126;
                        }
                      }
                    }
                    else {
                      fVar28 = (float)(uVar16 >> 0x18) / 255.0;
                      fVar29 = roundf((float)uVar19 * fVar28);
                      fVar30 = roundf((float)uVar23 * fVar28);
                      fVar28 = roundf((float)uVar22 * fVar28);
                      fVar29 = roundf(((float)((int)fVar29 & 0xff) / 255.0) * 5.0);
                      fVar30 = roundf(((float)((int)fVar30 & 0xff) / 255.0) * 5.0);
                      fVar28 = roundf(((float)((int)fVar28 & 0xff) / 255.0) * 5.0);
                      fVar28 = fVar28 + fVar30 * 6.0 + fVar29 * 36.0 + 16.0;
LAB_00125126:
                      col = (uchar)(int)fVar28;
                    }
                    drawTriangle(auVar39._0_8_,auVar31._0_8_,auVar47._0_8_,col,screen);
                    uVar42 = 0;
                    uVar43 = 0;
                    uVar44 = 0;
                    fVar29 = fVar32;
                  }
                  uVar26 = uVar26 + 3;
                  fVar32 = fVar29;
                } while (uVar26 < pIVar11[lVar21].ElemCount);
              }
            }
            lVar21 = lVar21 + 1;
          } while (lVar21 < (pIVar10->CmdBuffer).Size);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < drawData->CmdListsCount);
    }
  }
  return;
}

Assistant:

void ImTui_ImplText_RenderDrawData(ImDrawData * drawData, ImTui::TScreen * screen) {
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(drawData->DisplaySize.x * drawData->FramebufferScale.x);
    int fb_height = (int)(drawData->DisplaySize.y * drawData->FramebufferScale.y);

    if (fb_width <= 0 || fb_height <= 0) {
        return;
    }

    screen->resize(ImGui::GetIO().DisplaySize.x, ImGui::GetIO().DisplaySize.y);
    screen->clear();

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = drawData->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = drawData->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < drawData->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = drawData->CmdLists[n];

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            {
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    float lastCharX = -10000.0f;
                    float lastCharY = -10000.0f;

                    for (unsigned int i = 0; i < pcmd->ElemCount; i += 3) {
                        int vidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 0];
                        int vidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 1];
                        int vidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 2];

                        auto pos0 = cmd_list->VtxBuffer[vidx0].pos;
                        auto pos1 = cmd_list->VtxBuffer[vidx1].pos;
                        auto pos2 = cmd_list->VtxBuffer[vidx2].pos;

                        pos0.x = std::max(std::min(float(clip_rect.z - 1), pos0.x), clip_rect.x);
                        pos1.x = std::max(std::min(float(clip_rect.z - 1), pos1.x), clip_rect.x);
                        pos2.x = std::max(std::min(float(clip_rect.z - 1), pos2.x), clip_rect.x);
                        pos0.y = std::max(std::min(float(clip_rect.w - 1), pos0.y), clip_rect.y);
                        pos1.y = std::max(std::min(float(clip_rect.w - 1), pos1.y), clip_rect.y);
                        pos2.y = std::max(std::min(float(clip_rect.w - 1), pos2.y), clip_rect.y);

                        auto uv0 = cmd_list->VtxBuffer[vidx0].uv;
                        auto uv1 = cmd_list->VtxBuffer[vidx1].uv;
                        auto uv2 = cmd_list->VtxBuffer[vidx2].uv;

                        auto col0 = cmd_list->VtxBuffer[vidx0].col;
                        //auto col1 = cmd_list->VtxBuffer[vidx1].col;
                        //auto col2 = cmd_list->VtxBuffer[vidx2].col;

                        if (uv0.x != uv1.x || uv0.x != uv2.x || uv1.x != uv2.x ||
                            uv0.y != uv1.y || uv0.y != uv2.y || uv1.y != uv2.y) {
                            int vvidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 3];
                            int vvidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 4];
                            int vvidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 5];

                            auto ppos0 = cmd_list->VtxBuffer[vvidx0].pos;
                            auto ppos1 = cmd_list->VtxBuffer[vvidx1].pos;
                            auto ppos2 = cmd_list->VtxBuffer[vvidx2].pos;

                            float x = ((pos0.x + pos1.x + pos2.x + ppos0.x + ppos1.x + ppos2.x)/6.0f);
                            float y = ((pos0.y + pos1.y + pos2.y + ppos0.y + ppos1.y + ppos2.y)/6.0f) + 0.5f;

                            if (std::fabs(y - lastCharY) < 0.5f && std::fabs(x - lastCharX) < 0.5f) {
                                x = lastCharX + 1.0f;
                                y = lastCharY;
                            }

                            lastCharX = x;
                            lastCharY = y;

                            int xx = (x) + 1;
                            int yy = (y) + 0;
                            if (xx < clip_rect.x || xx >= clip_rect.z || yy < clip_rect.y || yy >= clip_rect.w) {
                            } else {
                                auto & cell = screen->data[yy*screen->nx + xx];
                                cell &= 0xFF000000;
                                cell |= (col0 & 0xff000000) >> 24;
                                cell |= ((ImTui::TCell)(rgbToAnsi256(col0, false)) << 16);
                            }
                            i += 3;
                        } else {
                            drawTriangle(pos0, pos1, pos2, rgbToAnsi256(col0, true), screen);
                        }
                    }
                }
            }
        }
    }

}